

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-emfile.c
# Opt level: O2

int run_test_emfile(void)

{
  int iVar1;
  int iVar2;
  uv_loop_t *puVar3;
  int *piVar4;
  char *pcVar5;
  undefined8 uStack_a0;
  sockaddr_in addr;
  rlimit limits;
  uv_connect_t connect_req;
  
  limits.rlim_max = 0x20;
  limits.rlim_cur = 0x20;
  iVar1 = setrlimit64(RLIMIT_NOFILE,(rlimit64 *)&limits);
  if (iVar1 == 0) {
    puVar3 = uv_default_loop();
    iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&addr);
    if (iVar1 == 0) {
      iVar1 = uv_tcp_init(puVar3,&server_handle);
      if (iVar1 == 0) {
        iVar1 = uv_tcp_init(puVar3,&client_handle);
        if (iVar1 == 0) {
          iVar1 = uv_tcp_bind(&server_handle,(sockaddr *)&addr,0);
          if (iVar1 == 0) {
            iVar1 = uv_listen((uv_stream_t *)&server_handle,8,connection_cb);
            if (iVar1 == 0) {
              do {
                iVar1 = dup(0);
                if (iVar1 != -1) {
                  if (0 < iVar1) goto LAB_001140dd;
                  break;
                }
                piVar4 = __errno_location();
              } while (*piVar4 == 4);
              pcVar5 = "first_fd > 0";
              uStack_a0 = 0x48;
            }
            else {
              pcVar5 = "0 == uv_listen((uv_stream_t*) &server_handle, 8, connection_cb)";
              uStack_a0 = 0x42;
            }
          }
          else {
            pcVar5 = "0 == uv_tcp_bind(&server_handle, (const struct sockaddr*) &addr, 0)";
            uStack_a0 = 0x41;
          }
        }
        else {
          pcVar5 = "0 == uv_tcp_init(loop, &client_handle)";
          uStack_a0 = 0x40;
        }
      }
      else {
        pcVar5 = "0 == uv_tcp_init(loop, &server_handle)";
        uStack_a0 = 0x3f;
      }
    }
    else {
      pcVar5 = "0 == uv_ip4_addr(\"127.0.0.1\", TEST_PORT, &addr)";
      uStack_a0 = 0x3e;
    }
  }
  else {
    piVar4 = __errno_location();
    if (*piVar4 == 1) {
      fprintf(_stderr,"%s\n","setrlimit(RLIMIT_NOFILE) failed, running under valgrind?");
      fflush(_stderr);
      return 1;
    }
    pcVar5 = "errno == EPERM";
    uStack_a0 = 0x39;
  }
LAB_0011421b:
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-emfile.c"
          ,uStack_a0,pcVar5);
  abort();
LAB_001140dd:
  do {
    do {
      iVar2 = dup(0);
    } while (iVar2 != -1);
    piVar4 = __errno_location();
  } while (*piVar4 == 4);
  if (*piVar4 == 0x18) {
    close(0x1f);
    iVar2 = uv_tcp_connect(&connect_req,&client_handle,(sockaddr *)&addr,connect_cb);
    if (iVar2 == 0) {
      iVar2 = uv_run(puVar3,UV_RUN_DEFAULT);
      if (iVar2 == 0) {
        if (connect_cb_called == 1) {
          for (; iVar1 < 0x1f; iVar1 = iVar1 + 1) {
            close(iVar1);
          }
          puVar3 = uv_default_loop();
          uv_walk(puVar3,close_walk_cb,(void *)0x0);
          uv_run(puVar3,UV_RUN_DEFAULT);
          puVar3 = uv_default_loop();
          iVar1 = uv_loop_close(puVar3);
          if (iVar1 == 0) {
            return 0;
          }
          pcVar5 = "0 == uv_loop_close(uv_default_loop())";
          uStack_a0 = 0x61;
        }
        else {
          pcVar5 = "1 == connect_cb_called";
          uStack_a0 = 0x57;
        }
      }
      else {
        pcVar5 = "0 == uv_run(loop, UV_RUN_DEFAULT)";
        uStack_a0 = 0x56;
      }
    }
    else {
      pcVar5 = 
      "0 == uv_tcp_connect(&connect_req, &client_handle, (const struct sockaddr*) &addr, connect_cb)"
      ;
      uStack_a0 = 0x55;
    }
  }
  else {
    pcVar5 = "errno == EMFILE";
    uStack_a0 = 0x4b;
  }
  goto LAB_0011421b;
}

Assistant:

TEST_IMPL(emfile) {
  struct sockaddr_in addr;
  struct rlimit limits;
  uv_connect_t connect_req;
  uv_loop_t* loop;
  int first_fd;
#if defined(_AIX) || defined(__MVS__)
  /* On AIX, if a 'accept' call fails ECONNRESET is set on the socket
   * which causes uv__emfile_trick to not work as intended and this test
   * to fail.
   */
  RETURN_SKIP("uv__emfile_trick does not work on this OS");
#endif

  /* Lower the file descriptor limit and use up all fds save one. */
  limits.rlim_cur = limits.rlim_max = maxfd + 1;
  if (setrlimit(RLIMIT_NOFILE, &limits)) {
    ASSERT(errno == EPERM);  /* Valgrind blocks the setrlimit() call. */
    RETURN_SKIP("setrlimit(RLIMIT_NOFILE) failed, running under valgrind?");
  }

  loop = uv_default_loop();
  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));
  ASSERT(0 == uv_tcp_init(loop, &server_handle));
  ASSERT(0 == uv_tcp_init(loop, &client_handle));
  ASSERT(0 == uv_tcp_bind(&server_handle, (const struct sockaddr*) &addr, 0));
  ASSERT(0 == uv_listen((uv_stream_t*) &server_handle, 8, connection_cb));

  /* Remember the first one so we can clean up afterwards. */
  do
    first_fd = dup(0);
  while (first_fd == -1 && errno == EINTR);
  ASSERT(first_fd > 0);

  while (dup(0) != -1 || errno == EINTR);
  ASSERT(errno == EMFILE);
  close(maxfd);

  /* Now connect and use up the last available file descriptor.  The EMFILE
   * handling logic in src/unix/stream.c should ensure that connect_cb() runs
   * whereas connection_cb() should *not* run.
   */
  ASSERT(0 == uv_tcp_connect(&connect_req,
                             &client_handle,
                             (const struct sockaddr*) &addr,
                             connect_cb));
  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));
  ASSERT(1 == connect_cb_called);

  /* Close the dups again. Ignore errors in the unlikely event that the
   * file descriptors were not contiguous.
   */
  while (first_fd < maxfd) {
    close(first_fd);
    first_fd += 1;
  }

  MAKE_VALGRIND_HAPPY();
  return 0;
}